

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge,uchar *data)

{
  long lVar1;
  secp256k1_ge_storage s;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  uint64_t uStack_30;
  uint64_t local_28;
  uint64_t uStack_20;
  ulong local_18;
  
  lVar1 = 0;
  do {
    local_18 = (ulong)data[lVar1];
    if (data[lVar1] != 0) goto LAB_0015289d;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  local_18 = 0;
LAB_0015289d:
  if ((int)local_18 != 0) {
    local_48 = *(uint64_t *)data;
    uStack_40 = *(uint64_t *)(data + 8);
    local_38 = *(uint64_t *)(data + 0x10);
    uStack_30 = *(uint64_t *)(data + 0x18);
    local_28 = *(uint64_t *)(data + 0x20);
    uStack_20 = *(uint64_t *)(data + 0x28);
    local_18 = *(ulong *)(data + 0x30);
    secp256k1_ge_from_storage(ge,(secp256k1_ge_storage *)&local_48);
    return;
  }
  ge->infinity = 1;
  (ge->x).n[0] = 0;
  (ge->x).n[1] = 0;
  (ge->x).n[2] = 0;
  (ge->x).n[3] = 0;
  *(undefined8 *)((long)(ge->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(ge->x).n + 0x24) = 0;
  (ge->x).normalized = 1;
  uStack_20 = 0x125285;
  secp256k1_fe_verify(&ge->x);
  *(undefined8 *)((long)(ge->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(ge->y).n + 0x24) = 0;
  (ge->y).n[2] = 0;
  (ge->y).n[3] = 0;
  (ge->y).n[0] = 0;
  (ge->y).n[1] = 0;
  (ge->y).normalized = 1;
  uStack_20 = 0x1252a0;
  secp256k1_fe_verify(&ge->y);
  secp256k1_ge_verify(ge);
  return;
}

Assistant:

static void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge, const unsigned char *data) {
    static const unsigned char zeros[64] = { 0 };
    if (secp256k1_memcmp_var(data, zeros, sizeof(zeros)) == 0) {
        secp256k1_ge_set_infinity(ge);
    } else {
        secp256k1_ge_from_bytes(ge, data);
    }
}